

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

TimePoint __thiscall hta::storage::file::Metric::epoch(Metric *this,Duration interval)

{
  TimePoint TVar1;
  
  TVar1 = epoch(this);
  TVar1 = interval_begin(TVar1,interval);
  return (TimePoint)
         TVar1.
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
}

Assistant:

TimePoint Metric::epoch(Duration interval)
{
    return interval_begin(epoch(), interval);
}